

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_crecord.c
# Opt level: O1

void recff_cdata_arith(jit_State *J,RecordFFData *rd)

{
  CType *pCVar1;
  TRef *pTVar2;
  TValue *pTVar3;
  uint64_t uVar4;
  int32_t k;
  ushort uVar5;
  IRType IVar6;
  TRef TVar7;
  CTSize CVar8;
  TRef TVar9;
  CTypeID CVar10;
  GCcdata *pGVar11;
  CType *pCVar12;
  cTValue *pcVar13;
  ushort uVar14;
  ushort uVar15;
  uint uVar16;
  uint uVar17;
  int iVar18;
  uint uVar19;
  IRRef1 IVar20;
  long lVar21;
  undefined4 uVar22;
  CTState *pCVar23;
  GCobj *o;
  ulong uVar24;
  uint *puVar25;
  IRRef1 IVar26;
  TRef tr;
  bool bVar27;
  TRef sp [2];
  CType *s [2];
  CTSize ofs;
  uint local_78;
  uint local_74;
  CTState *local_70;
  RecordFFData *local_68;
  jit_State *local_60;
  uint *local_58 [3];
  CTState *local_40;
  CTSize local_34;
  
  pCVar23 = *(CTState **)&J[-1].penalty[0x3c].val;
  lVar21 = 0;
  local_70 = pCVar23;
  local_68 = rd;
  local_60 = J;
  do {
    uVar19 = J->base[lVar21];
    if (uVar19 == 0) goto LAB_00137214;
    uVar16 = uVar19 & 0x1f000000;
    if (uVar16 == 0) {
      uVar19 = lj_ir_kptr_(J,IR_KPTR,(void *)0x0);
LAB_0013676a:
      pCVar12 = pCVar23->tab + 0x11;
    }
    else {
      IVar20 = (IRRef1)uVar19;
      if (uVar16 == 0xa000000) {
        pGVar11 = argv2cdata(J,uVar19,local_68->argv + lVar21);
        uVar5 = pGVar11->ctypeid;
        uVar19 = pCVar23->tab[uVar5].info;
        pCVar12 = pCVar23->tab + uVar5;
        IVar6 = crec_ct2irt(pCVar23,pCVar12);
        J = local_60;
        uVar19 = uVar19 >> 0x1c;
        uVar14 = (ushort)IVar6;
        if (uVar19 == 2) {
          (local_60->fold).ins.field_0.ot = uVar14 | 0x4500;
          (local_60->fold).ins.field_0.op1 = IVar20;
          (local_60->fold).ins.field_0.op2 = 0x17;
          uVar19 = lj_opt_fold(local_60);
          if ((pCVar12->info & 0xf0800000) == 0x20800000) {
            pCVar12 = local_70->tab + (ushort)pCVar12->info;
            IVar6 = crec_ct2irt(local_70,pCVar12);
          }
LAB_00136713:
          if ((pCVar12->info & 0xf0000000) == 0x50000000) {
            pCVar12 = (CType *)((long)&local_70->tab->info +
                               (ulong)((pCVar12->info & 0xffff) * 0x18));
          }
          pCVar23 = local_70;
          if (pCVar12->info < 0x10000000) {
            if (IVar6 != IRT_CDATA) {
              (J->fold).ins.field_0.ot = (ushort)IVar6 | 0x4600;
              (J->fold).ins.field_0.op1 = (IRRef1)uVar19;
              (J->fold).ins.field_0.op2 = 0;
              goto LAB_00136982;
            }
            uVar19 = 0;
          }
        }
        else if (IVar6 - IRT_I64 < 2) {
          (local_60->fold).ins.field_0.ot = uVar14 | 0x4500;
          (local_60->fold).ins.field_0.op1 = IVar20;
          (local_60->fold).ins.field_0.op2 = 0x19;
LAB_00136982:
          uVar19 = lj_opt_fold(J);
          pCVar23 = local_70;
        }
        else {
          if (IVar6 - IRT_INT < 2) {
            (local_60->fold).ins.field_0.ot = uVar14 | 0x4500;
            (local_60->fold).ins.field_0.op1 = IVar20;
            (local_60->fold).ins.field_0.op2 = 0x18;
            uVar19 = lj_opt_fold(local_60);
            pCVar23 = local_70;
            if ((pCVar12->info & 0xf0000000) != 0x50000000) goto LAB_00136991;
            uVar24 = (ulong)((pCVar12->info & 0xffff) * 0x18);
          }
          else {
            if (uVar19 != 6) {
              TVar7 = lj_ir_kint64(local_60,0x10);
              (J->fold).ins.field_0.ot = 0x2909;
              (J->fold).ins.field_0.op1 = IVar20;
              (J->fold).ins.field_0.op2 = (IRRef1)TVar7;
              uVar19 = lj_opt_fold(J);
              goto LAB_00136713;
            }
            (local_60->fold).ins.field_0.op1 = IVar20;
            *(undefined4 *)((long)&(local_60->fold).ins.field_1.op12 + 2) = 0x45090017;
            uVar19 = lj_opt_fold(local_60);
            pCVar23 = local_70;
            CVar10 = lj_ctype_intern(local_70,uVar5 | 0x20030000,8);
            uVar24 = (ulong)CVar10 * 0x18;
          }
          pCVar12 = (CType *)((long)&pCVar23->tab->info + uVar24);
        }
      }
      else {
        pCVar12 = pCVar23->tab;
        if ((uVar19 >> 0x18 & 0x1f) - 0xf < 5) {
          pCVar12 = pCVar12 + 9;
        }
        else if (uVar16 == 0xe000000) {
          pCVar12 = pCVar12 + 0xe;
        }
        else if (uVar16 == 0x4000000) {
          iVar18 = 1 - (int)lVar21;
          pGVar11 = argv2cdata(J,*(TRef *)((long)J->base + (ulong)(uint)(iVar18 * 4)),
                               (cTValue *)((ulong)(uint)(iVar18 * 8) + (long)local_68->argv));
          pCVar1 = pCVar23->tab;
          pCVar12 = pCVar1 + pGVar11->ctypeid;
          uVar16 = pCVar1[pGVar11->ctypeid].info >> 0x1c;
          if (uVar16 == 2) {
            TVar7 = lj_ir_kint64(J,0x18);
            (J->fold).ins.field_0.ot = 0x2909;
            (J->fold).ins.field_0.op1 = IVar20;
            (J->fold).ins.field_0.op2 = (IRRef1)TVar7;
            uVar19 = lj_opt_fold(J);
          }
          else if (uVar16 == 5) {
            o = (GCobj *)(local_68->argv[lVar21].u64 & 0x7fffffffffff);
            pCVar12 = lj_ctype_getfieldq(pCVar23,pCVar12,&o->str,&local_34,(CTInfo *)0x0);
            pCVar23 = local_70;
            if ((pCVar12 == (CType *)0x0) || ((pCVar12->info & 0xf0000000) != 0xb0000000))
            goto LAB_0013676a;
            TVar7 = lj_ir_kgc(J,o,IRT_STR);
            (J->fold).ins.field_0.ot = 0x884;
            (J->fold).ins.field_0.op1 = IVar20;
            (J->fold).ins.field_0.op2 = (IRRef1)TVar7;
            lj_opt_fold(J);
            pCVar23 = local_70;
            pCVar12 = (CType *)((long)&local_70->tab->info +
                               (ulong)((uint)(ushort)pCVar12->info * 0x18));
            uVar19 = lj_ir_kint(J,local_34);
          }
          else {
            pCVar12 = pCVar1 + 0x11;
          }
        }
        else {
          pCVar12 = pCVar12 + 0x11;
          uVar19 = 0;
        }
      }
    }
LAB_00136991:
    local_58[lVar21] = &pCVar12->info;
    (&local_78)[lVar21] = uVar19;
    bVar27 = lVar21 == 0;
    lVar21 = lVar21 + 1;
  } while (bVar27);
  uVar19 = local_68->data;
  if ((uVar19 != 5) && (uVar19 != 8)) {
    TVar7 = 0;
    if ((local_78 != 0) &&
       (((local_74 != 0 && (uVar16 = *local_58[0], TVar7 = 0, uVar16 < 0x10000000)) &&
        (uVar17 = *local_58[1], uVar17 < 0x10000000)))) {
      if ((((uVar16 >> 0x17 & 1) == 0) || (local_58[0][1] != 8)) &&
         (((uVar17 >> 0x17 & 1) == 0 || (local_58[1][1] != 8)))) {
        uVar5 = 0x15;
        uVar22 = 0xb;
        if ((((9 < uVar19) || (((uVar17 | uVar16) >> 0x1a & 1) != 0)) ||
            ((local_58[0][1] != 4 || (local_58[1][1] != 4)))) ||
           (((((uVar17 ^ uVar16) >> 0x17 & 1) != 0 &&
             (((short)local_74 < 0 || ((J->cur).ir[local_74 & 0x7fff].i < 0)))) &&
            (((short)local_78 < 0 || (uVar16 = uVar17, (J->cur).ir[local_78 & 0x7fff].i < 0))))))
        goto LAB_00136d57;
        uVar5 = ((uVar16 >> 0x17 & 1) != 0) + 0x13;
      }
      else {
        uVar5 = 0x16;
        uVar22 = 0xc;
LAB_00136d57:
        local_40 = (CTState *)CONCAT44(local_40._4_4_,uVar22);
        lVar21 = 0;
        do {
          uVar16 = (&local_78)[lVar21];
          uVar17 = uVar16 >> 0x18 & 0x1f;
          if (uVar17 - 0xd < 2) {
            uVar14 = (short)uVar17 + uVar5 * 0x20 + 0x1000;
LAB_00136dab:
            (J->fold).ins.field_0.ot = uVar5 + 0x5b00;
            (J->fold).ins.field_0.op1 = (IRRef1)uVar16;
            (J->fold).ins.field_0.op2 = uVar14;
            TVar7 = lj_opt_fold(J);
            (&local_78)[lVar21] = TVar7;
          }
          else if (1 < uVar17 - 0x15) {
            uVar14 = ((ushort)(*local_58[lVar21] >> 0xc) & 0x800 | uVar5 * 0x20) ^ 0x813;
            goto LAB_00136dab;
          }
          lVar21 = lVar21 + 1;
        } while (lVar21 == 1);
        if (9 < uVar19) {
          (J->fold).ins.field_0.ot = (short)(uVar19 << 8) + uVar5 + 0x1f00;
          (J->fold).ins.field_0.op1 = (IRRef1)local_78;
          (J->fold).ins.field_0.op2 = (IRRef1)local_74;
          TVar7 = lj_opt_fold(J);
          TVar9 = lj_ir_kint(J,(int32_t)local_40);
          (J->fold).ins.field_0.ot = 0x548a;
          (J->fold).ins.field_0.op1 = (IRRef1)TVar9;
          (J->fold).ins.field_0.op2 = (IRRef1)TVar7;
          TVar7 = lj_opt_fold(J);
          goto LAB_00136ea0;
        }
      }
      uVar14 = 0x800;
      if (uVar19 != 4) {
        uVar15 = (ushort)(uVar19 != 6) * 0x200;
        uVar14 = uVar15 + 0x400;
        if ((uVar5 & 0xfffd) != 0x14) {
          uVar14 = uVar15;
        }
      }
      (J->fold).ins.field_0.ot = uVar14 | uVar5 | 0x80;
      (J->fold).ins.field_0.op1 = (IRRef1)local_78;
      (J->fold).ins.field_0.op2 = (IRRef1)local_74;
      J->postproc = LJ_POST_FIXGUARD;
      TVar7 = 0x2007ffd;
    }
LAB_00136ea0:
    uVar16 = local_78;
    if (TVar7 != 0) goto LAB_001371ae;
    TVar9 = 0;
    TVar7 = 0;
    if ((local_78 != 0) && (local_74 != 0)) {
      pCVar23 = *(CTState **)&J[-1].penalty[0x3c].val;
      uVar17 = *local_58[0];
      TVar7 = TVar9;
      if ((uVar17 & 0xf0000000) == 0x20000000 || (uVar17 & 0xfc000000) == 0x30000000) {
        if (((0xb < uVar19) || ((0x8d0U >> (uVar19 & 0x1f) & 1) == 0)) ||
           ((*local_58[1] & 0xf0000000) != 0x20000000 && (*local_58[1] & 0xfc000000) != 0x30000000))
        {
          if (((uVar19 & 0xfffffffe) == 10) && (puVar25 = local_58[0], *local_58[1] < 0x10000000))
          goto LAB_00137048;
          goto LAB_001371a1;
        }
        IVar26 = (IRRef1)local_78;
        IVar20 = (IRRef1)local_74;
        if (uVar19 == 4) {
          uVar5 = 0x889;
        }
        else {
          if (uVar19 == 0xb) {
            CVar8 = lj_ctype_size(pCVar23,uVar17 & 0xffff);
            if (POPCOUNT(CVar8) != 1) goto LAB_001371a1;
            (J->fold).ins.field_0.ot = 0x2a15;
            (J->fold).ins.field_0.op1 = IVar26;
            (J->fold).ins.field_0.op2 = IVar20;
            TVar7 = lj_opt_fold(J);
            k = 0x1f;
            if (CVar8 != 0) {
              for (; CVar8 >> k == 0; k = k + -1) {
              }
            }
            TVar9 = lj_ir_kint(J,k);
            (J->fold).ins.field_0.ot = 0x2615;
            (J->fold).ins.field_0.op1 = (IRRef1)TVar7;
            (J->fold).ins.field_0.op2 = (IRRef1)TVar9;
            TVar7 = lj_opt_fold(J);
            (J->fold).ins.field_0.op1 = (IRRef1)TVar7;
            *(undefined4 *)((long)&(J->fold).ins.field_1.op12 + 2) = 0x5b0e01d5;
            goto LAB_00137197;
          }
          uVar5 = (ushort)(uVar19 != 6) << 9 | 0x489;
        }
        (J->fold).ins.field_0.ot = uVar5;
        (J->fold).ins.field_0.op1 = IVar26;
        (J->fold).ins.field_0.op2 = IVar20;
        J->postproc = LJ_POST_FIXGUARD;
        TVar7 = 0x2007ffd;
      }
      else {
        if ((0xfffffff < uVar17 || uVar19 != 10) ||
           ((*local_58[1] & 0xf0000000) != 0x20000000 && (*local_58[1] & 0xfc000000) != 0x30000000))
        goto LAB_001371a1;
        local_78 = local_74;
        local_74 = uVar16;
        puVar25 = local_58[1];
LAB_00137048:
        uVar16 = local_74;
        uVar17 = local_74 >> 0x18 & 0x1f;
        local_40 = pCVar23;
        CVar8 = lj_ctype_size(pCVar23,(uint)(ushort)*puVar25);
        if (uVar17 - 0xd < 2) {
          uVar5 = (ushort)uVar17 | 0x12a0;
LAB_001370d9:
          (J->fold).ins.field_0.ot = 0x5b15;
          (J->fold).ins.field_0.op1 = (IRRef1)uVar16;
          (J->fold).ins.field_0.op2 = uVar5;
          uVar16 = lj_opt_fold(J);
        }
        else if (1 < uVar17 - 0x15) {
          uVar5 = (ushort)(uVar16 >> 0xd) & 0x800 | 0x2b3;
          goto LAB_001370d9;
        }
        TVar7 = lj_ir_kint64(J,(ulong)CVar8);
        (J->fold).ins.field_0.ot = 0x2b15;
        (J->fold).ins.field_0.op1 = (IRRef1)uVar16;
        (J->fold).ins.field_0.op2 = (IRRef1)TVar7;
        TVar7 = lj_opt_fold(J);
        (J->fold).ins.field_0.ot = (short)(uVar19 << 8) + 0x1f09;
        (J->fold).ins.field_0.op1 = (IRRef1)local_78;
        (J->fold).ins.field_0.op2 = (IRRef1)TVar7;
        TVar7 = lj_opt_fold(J);
        CVar10 = lj_ctype_intern(local_40,(ushort)*puVar25 | 0x20030000,8);
        TVar9 = lj_ir_kint(J,CVar10);
        (J->fold).ins.field_0.ot = 0x548a;
        (J->fold).ins.field_0.op1 = (IRRef1)TVar9;
        (J->fold).ins.field_0.op2 = (IRRef1)TVar7;
LAB_00137197:
        TVar7 = lj_opt_fold(J);
      }
    }
LAB_001371a1:
    pCVar23 = local_70;
    if (TVar7 != 0) goto LAB_001371ae;
  }
  if (*J->base == 0) {
LAB_00136c0b:
    pcVar13 = (cTValue *)0x0;
  }
  else {
    if ((local_68->argv->u64 & 0xffff800000000000) == 0xfffa800000000000) {
      pGVar11 = argv2cdata(J,*J->base,local_68->argv);
      uVar19 = pCVar23->tab[pGVar11->ctypeid].info;
      uVar16 = (uint)pGVar11->ctypeid;
      if ((uVar19 & 0xf0000000) == 0x20000000) {
        uVar16 = uVar19 & 0xffff;
      }
      pcVar13 = lj_ctype_meta(pCVar23,uVar16,local_68->data);
    }
    else {
      pcVar13 = (cTValue *)0x0;
    }
    if (pcVar13 == (cTValue *)0x0) {
      if ((J->base[1] == 0) || ((local_68->argv[1].u64 & 0xffff800000000000) != 0xfffa800000000000))
      goto LAB_00136c0b;
      pGVar11 = argv2cdata(J,J->base[1],local_68->argv + 1);
      uVar19 = local_70->tab[pGVar11->ctypeid].info;
      uVar16 = (uint)pGVar11->ctypeid;
      if ((uVar19 & 0xf0000000) == 0x20000000) {
        uVar16 = uVar19 & 0xffff;
      }
      pcVar13 = lj_ctype_meta(local_70,uVar16,local_68->data);
    }
  }
  if (pcVar13 == (cTValue *)0x0) {
    if (local_68->data != 4) goto LAB_00137214;
    TVar7 = 0x1007ffe;
    if (((local_78 != 0) && (local_74 != 0)) &&
       (*local_58[0] < 0x10000000 != 0xfffffff < *local_58[1])) {
      (J->fold).ins.field_0.ot = 0x889;
      (J->fold).ins.field_0.op1 = (IRRef1)local_78;
      (J->fold).ins.field_0.op2 = (IRRef1)local_74;
      J->postproc = LJ_POST_FIXGUARD;
      TVar7 = 0x2007ffd;
    }
  }
  else {
    if ((pcVar13->u64 & 0xffff800000000000) != 0xfffb800000000000) {
LAB_00137214:
      lj_trace_err(J,LJ_TRERR_BADTYPE);
    }
    TVar7 = lj_ir_kgc(J,(GCobj *)(pcVar13->u64 & 0x7fffffffffff),IRT_FUNC);
    pTVar2 = J->base;
    pTVar2[-2] = TVar7;
    pTVar2[-1] = 0x10000;
    local_68->nres = -1;
    TVar7 = 0;
  }
  if (pcVar13 != (cTValue *)0x0) {
    return;
  }
LAB_001371ae:
  *J->base = TVar7;
  if (((J->postproc == LJ_POST_FIXGUARD) && (pTVar3 = J->L->base, (pTVar3[-1].u32.lo & 7) == 2)) &&
     ((-1 < (char)(J->guardemit).irt &&
      (uVar4 = pTVar3[-3].u64, (*(uint *)(uVar4 - 4) & 0xfc) < 0xc)))) {
    J[-1].penalty[0x33].pc.ptr64 = uVar4 - 4;
    J->postproc = LJ_POST_FIXCOMP;
  }
  return;
}

Assistant:

void LJ_FASTCALL recff_cdata_arith(jit_State *J, RecordFFData *rd)
{
  CTState *cts = ctype_ctsG(J2G(J));
  TRef sp[2];
  CType *s[2];
  MSize i;
  for (i = 0; i < 2; i++) {
    TRef tr = J->base[i];
    CType *ct = ctype_get(cts, CTID_DOUBLE);
    if (!tr) {
      lj_trace_err(J, LJ_TRERR_BADTYPE);
    } else if (tref_iscdata(tr)) {
      CTypeID id = argv2cdata(J, tr, &rd->argv[i])->ctypeid;
      IRType t;
      ct = ctype_raw(cts, id);
      t = crec_ct2irt(cts, ct);
      if (ctype_isptr(ct->info)) {  /* Resolve pointer or reference. */
	tr = emitir(IRT(IR_FLOAD, t), tr, IRFL_CDATA_PTR);
	if (ctype_isref(ct->info)) {
	  ct = ctype_rawchild(cts, ct);
	  t = crec_ct2irt(cts, ct);
	}
      } else if (t == IRT_I64 || t == IRT_U64) {
	tr = emitir(IRT(IR_FLOAD, t), tr, IRFL_CDATA_INT64);
	lj_needsplit(J);
	goto ok;
      } else if (t == IRT_INT || t == IRT_U32) {
	tr = emitir(IRT(IR_FLOAD, t), tr, IRFL_CDATA_INT);
	if (ctype_isenum(ct->info)) ct = ctype_child(cts, ct);
	goto ok;
      } else if (ctype_isfunc(ct->info)) {
	tr = emitir(IRT(IR_FLOAD, IRT_PTR), tr, IRFL_CDATA_PTR);
	ct = ctype_get(cts,
	  lj_ctype_intern(cts, CTINFO(CT_PTR, CTALIGN_PTR|id), CTSIZE_PTR));
	goto ok;
      } else {
	tr = emitir(IRT(IR_ADD, IRT_PTR), tr, lj_ir_kintp(J, sizeof(GCcdata)));
      }
      if (ctype_isenum(ct->info)) ct = ctype_child(cts, ct);
      if (ctype_isnum(ct->info)) {
	if (t == IRT_CDATA) {
	  tr = 0;
	} else {
	  if (t == IRT_I64 || t == IRT_U64) lj_needsplit(J);
	  tr = emitir(IRT(IR_XLOAD, t), tr, 0);
	}
      }
    } else if (tref_isnil(tr)) {
      tr = lj_ir_kptr(J, NULL);
      ct = ctype_get(cts, CTID_P_VOID);
    } else if (tref_isinteger(tr)) {
      ct = ctype_get(cts, CTID_INT32);
    } else if (tref_isstr(tr)) {
      TRef tr2 = J->base[1-i];
      CTypeID id = argv2cdata(J, tr2, &rd->argv[1-i])->ctypeid;
      ct = ctype_raw(cts, id);
      if (ctype_isenum(ct->info)) {  /* Match string against enum constant. */
	GCstr *str = strV(&rd->argv[i]);
	CTSize ofs;
	CType *cct = lj_ctype_getfield(cts, ct, str, &ofs);
	if (cct && ctype_isconstval(cct->info)) {
	  /* Specialize to the name of the enum constant. */
	  emitir(IRTG(IR_EQ, IRT_STR), tr, lj_ir_kstr(J, str));
	  ct = ctype_child(cts, cct);
	  tr = lj_ir_kint(J, (int32_t)ofs);
	} else {  /* Interpreter will throw or return false. */
	  ct = ctype_get(cts, CTID_P_VOID);
	}
      } else if (ctype_isptr(ct->info)) {
	tr = emitir(IRT(IR_ADD, IRT_PTR), tr, lj_ir_kintp(J, sizeof(GCstr)));
      } else {
	ct = ctype_get(cts, CTID_P_VOID);
      }
    } else if (!tref_isnum(tr)) {
      tr = 0;
      ct = ctype_get(cts, CTID_P_VOID);
    }
  ok:
    s[i] = ct;
    sp[i] = tr;
  }
  {
    TRef tr;
    MMS mm = (MMS)rd->data;
    if ((mm == MM_len || mm == MM_concat ||
	 (!(tr = crec_arith_int64(J, sp, s, mm)) &&
	  !(tr = crec_arith_ptr(J, sp, s, mm)))) &&
	!(tr = crec_arith_meta(J, sp, s, cts, rd)))
      return;
    J->base[0] = tr;
    /* Fixup cdata comparisons, too. Avoids some cdata escapes. */
    if (J->postproc == LJ_POST_FIXGUARD && frame_iscont(J->L->base-1) &&
	!irt_isguard(J->guardemit)) {
      const BCIns *pc = frame_contpc(J->L->base-1) - 1;
      if (bc_op(*pc) <= BC_ISNEP) {
	J2G(J)->tmptv.u64 = (uint64_t)(uintptr_t)pc;
	J->postproc = LJ_POST_FIXCOMP;
      }
    }
  }
}